

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_value_is_json_object(jx9_value *pVal)

{
  jx9_hashmap *pMap;
  jx9_value *pVal_local;
  
  if ((pVal->iFlags & 0x40U) == 0) {
    pVal_local._4_4_ = 0;
  }
  else if ((*(uint *)((pVal->x).iVal + 0x40) & 1) == 0) {
    pVal_local._4_4_ = 0;
  }
  else {
    pVal_local._4_4_ = 1;
  }
  return pVal_local._4_4_;
}

Assistant:

JX9_PRIVATE int jx9_value_is_json_object(jx9_value *pVal)
{
	jx9_hashmap *pMap;
	if( (pVal->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return FALSE;
	}
	pMap = (jx9_hashmap *)pVal->x.pOther;
	if( (pMap->iFlags & HASHMAP_JSON_OBJECT) == 0 ){
		return FALSE;
	}
	return TRUE;
}